

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumValueOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::EnumValueOptions>
          (Tables *this,EnumValueOptions *param_2)

{
  EnumValueOptions *pEVar1;
  EnumValueOptions *in_RSI;
  EnumValueOptions *result;
  EnumValueOptions **in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  pEVar1 = (EnumValueOptions *)operator_new(0x50);
  EnumValueOptions::EnumValueOptions(in_RSI);
  std::
  vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
  ::emplace_back<google::protobuf::EnumValueOptions*&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return pEVar1;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}